

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SudokuGenerator.h
# Opt level: O1

void __thiscall SudokuGenerator::SudokuGenerator(SudokuGenerator *this,uint elements)

{
  this->elementCount = elements;
  (this->errorInRow).super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)&this->errorInRow;
  (this->errorInRow).super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&this->errorInRow;
  (this->errorInRow).super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size = 0;
  SudokuGitter::SudokuGitter(&this->gitter,elements);
  return;
}

Assistant:

explicit SudokuGenerator(unsigned int elements) : elementCount(elements), gitter(SudokuGitter(elements)) {}